

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O3

MPP_RET test_mpp_enc_cfg_setup(MpiEncMultiCtxInfo *info)

{
  RK_U32 *pRVar1;
  RK_U32 *pRVar2;
  RK_U32 *pRVar3;
  MppCodingType MVar4;
  uint uVar5;
  MpiEncTestArgs *pMVar6;
  MppParam pvVar7;
  MppCtx pvVar8;
  MppApi *pMVar9;
  int iVar10;
  MPP_RET MVar11;
  int iVar12;
  char *pcVar13;
  RK_U32 RVar14;
  RK_S32 *pRVar15;
  RK_S32 *pRVar16;
  RK_S32 *pRVar17;
  bool bVar18;
  RK_U32 gop_mode;
  MppEncRefCfg ref;
  MppCtx local_68;
  RK_U32 local_60;
  RK_U32 local_5c;
  MppApi *local_58;
  RK_U32 flip;
  RK_U32 mirroring;
  RK_U32 rotation;
  RK_U32 constraint_set;
  MppCodingType local_38;
  
  pMVar6 = info->cmd;
  local_68 = (info->ctx).ctx;
  local_58 = (info->ctx).mpi;
  pvVar7 = (info->ctx).cfg;
  local_60 = pMVar6->quiet;
  gop_mode = (info->ctx).gop_mode;
  ref = (MppEncRefCfg)0x0;
  if ((info->ctx).fps_in_den == 0) {
    (info->ctx).fps_in_den = 1;
  }
  if ((info->ctx).fps_in_num == 0) {
    (info->ctx).fps_in_num = 0x1e;
  }
  iVar12 = (info->ctx).fps_out_den;
  if (iVar12 == 0) {
    (info->ctx).fps_out_den = 1;
    iVar12 = 1;
  }
  iVar10 = (info->ctx).fps_out_num;
  if (iVar10 == 0) {
    (info->ctx).fps_out_num = 0x1e;
    iVar10 = 0x1e;
  }
  RVar14 = (info->ctx).width;
  if ((info->ctx).bps == 0) {
    (info->ctx).bps = (iVar10 / iVar12) * ((info->ctx).height * RVar14 >> 3);
  }
  local_5c = gop_mode;
  mpp_enc_cfg_set_s32(pvVar7,"prep:width",RVar14);
  mpp_enc_cfg_set_s32(pvVar7,"prep:height",(info->ctx).height);
  mpp_enc_cfg_set_s32(pvVar7,"prep:hor_stride",(info->ctx).hor_stride);
  mpp_enc_cfg_set_s32(pvVar7,"prep:ver_stride",(info->ctx).ver_stride);
  mpp_enc_cfg_set_s32(pvVar7,"prep:format",(info->ctx).fmt);
  mpp_enc_cfg_set_s32(pvVar7,"prep:range",2);
  mpp_env_get_u32("mirroring",&mirroring,0);
  mpp_env_get_u32("rotation",&rotation,0);
  mpp_env_get_u32("flip",&flip,0);
  mpp_enc_cfg_set_s32(pvVar7,"prep:mirroring",mirroring);
  mpp_enc_cfg_set_s32(pvVar7,"prep:rotation",rotation);
  mpp_enc_cfg_set_s32(pvVar7,"prep:flip",flip);
  mpp_enc_cfg_set_s32(pvVar7,"rc:mode",(info->ctx).rc_mode);
  mpp_enc_cfg_set_u32(pvVar7,"rc:max_reenc_times",0);
  mpp_enc_cfg_set_u32(pvVar7,"rc:super_mode",0);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_in_flex",(info->ctx).fps_in_flex);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_in_num",(info->ctx).fps_in_num);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_in_denom",(info->ctx).fps_in_den);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_out_flex",(info->ctx).fps_out_flex);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_out_num",(info->ctx).fps_out_num);
  mpp_enc_cfg_set_s32(pvVar7,"rc:fps_out_denom",(info->ctx).fps_out_den);
  mpp_enc_cfg_set_u32(pvVar7,"rc:drop_mode",0);
  mpp_enc_cfg_set_u32(pvVar7,"rc:drop_thd",0x14);
  mpp_enc_cfg_set_u32(pvVar7,"rc:drop_gap",1);
  mpp_enc_cfg_set_s32(pvVar7,"rc:bps_target",(info->ctx).bps);
  switch((info->ctx).rc_mode) {
  case 0:
  case 3:
    iVar12 = (info->ctx).bps_max;
    if (iVar12 == 0) {
      iVar12 = (info->ctx).bps;
      iVar10 = iVar12 * 0x11;
      iVar12 = iVar12 * 0x11 + 0xf;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
      iVar12 = iVar12 >> 4;
    }
    mpp_enc_cfg_set_s32(pvVar7,"rc:bps_max",iVar12);
    iVar12 = (info->ctx).bps_min;
    if (iVar12 == 0) {
      iVar10 = (info->ctx).bps;
      iVar12 = iVar10 + 0xf;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
LAB_001072b2:
      iVar12 = iVar12 >> 4;
    }
    break;
  default:
    iVar12 = (info->ctx).bps_max;
    if (iVar12 == 0) {
      iVar12 = (info->ctx).bps;
      iVar10 = iVar12 * 0x11;
      iVar12 = iVar12 * 0x11 + 0xf;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
      iVar12 = iVar12 >> 4;
    }
    mpp_enc_cfg_set_s32(pvVar7,"rc:bps_max",iVar12);
    iVar12 = (info->ctx).bps_min;
    if (iVar12 == 0) {
      iVar12 = (info->ctx).bps;
      iVar10 = iVar12 * 0xf;
      iVar12 = iVar12 * 0xf + 0xf;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
      goto LAB_001072b2;
    }
    break;
  case 2:
    goto switchD_00107211_caseD_2;
  }
  mpp_enc_cfg_set_s32(pvVar7,"rc:bps_min",iVar12);
switchD_00107211_caseD_2:
  MVar4 = (info->ctx).type;
  if (MVar4 == MPP_VIDEO_CodingMJPEG) {
    iVar12 = 0x50;
    if (pMVar6->qp_init != 0) {
      iVar12 = pMVar6->qp_init;
    }
    mpp_enc_cfg_set_s32(pvVar7,"jpeg:q_factor",iVar12);
    iVar12 = 99;
    if (pMVar6->qp_max != 0) {
      iVar12 = pMVar6->qp_max;
    }
    mpp_enc_cfg_set_s32(pvVar7,"jpeg:qf_max",iVar12);
    iVar12 = pMVar6->qp_min + (uint)(pMVar6->qp_min == 0);
    pcVar13 = "jpeg:qf_min";
LAB_001074e4:
    mpp_enc_cfg_set_s32(pvVar7,pcVar13,iVar12);
  }
  else {
    if (MVar4 == MPP_VIDEO_CodingVP8) {
      iVar12 = 0x28;
      if (pMVar6->qp_init != 0) {
        iVar12 = pMVar6->qp_init;
      }
      mpp_enc_cfg_set_s32(pvVar7,"rc:qp_init",iVar12);
      iVar12 = pMVar6->qp_max;
      if (iVar12 == 0) {
        iVar12 = 0x7f;
      }
      mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max",iVar12);
      mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min",pMVar6->qp_min);
      iVar12 = pMVar6->qp_max_i;
      if (pMVar6->qp_max_i == 0) {
        iVar12 = 0x7f;
      }
      mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max_i",iVar12);
      mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min_i",pMVar6->qp_min_i);
      pcVar13 = "rc:qp_ip";
      iVar12 = 6;
      goto LAB_001074e4;
    }
    if (MVar4 == MPP_VIDEO_CodingHEVC) {
      uVar5 = (info->ctx).rc_mode;
      if (uVar5 < 5) {
        if (uVar5 == 2) {
          iVar12 = pMVar6->qp_init;
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_init",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max_i",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min_i",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_ip",0);
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_min_i",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_max_i",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_min_p",iVar12);
          pcVar13 = "rc:fqp_max_p";
        }
        else {
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_init",-(uint)(pMVar6->qp_init == 0) | pMVar6->qp_init);
          iVar12 = pMVar6->qp_max;
          if (iVar12 == 0) {
            iVar12 = 0x33;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max",iVar12);
          iVar12 = pMVar6->qp_min;
          if (iVar12 == 0) {
            iVar12 = 10;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min",iVar12);
          iVar12 = pMVar6->qp_max_i;
          if (pMVar6->qp_max_i == 0) {
            iVar12 = 0x33;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_max_i",iVar12);
          iVar12 = pMVar6->qp_min_i;
          if (pMVar6->qp_min_i == 0) {
            iVar12 = 10;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_min_i",iVar12);
          mpp_enc_cfg_set_s32(pvVar7,"rc:qp_ip",2);
          iVar12 = pMVar6->fqp_min_i;
          if (iVar12 == 0) {
            iVar12 = 10;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_min_i",iVar12);
          iVar12 = pMVar6->fqp_max_i;
          if (iVar12 == 0) {
            iVar12 = 0x2d;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_max_i",iVar12);
          iVar12 = pMVar6->fqp_min_p;
          if (pMVar6->fqp_min_p == 0) {
            iVar12 = 10;
          }
          mpp_enc_cfg_set_s32(pvVar7,"rc:fqp_min_p",iVar12);
          iVar12 = pMVar6->fqp_max_p;
          if (pMVar6->fqp_max_p == 0) {
            iVar12 = 0x2d;
          }
          pcVar13 = "rc:fqp_max_p";
        }
        goto LAB_001074e4;
      }
      _mpp_log_l(2,"mpi_enc_test","unsupport encoder rc mode %d\n","test_mpp_enc_cfg_setup");
    }
  }
  mpp_enc_cfg_set_s32(pvVar7,"codec:type",(info->ctx).type);
  MVar4 = (info->ctx).type;
  if (1 < MVar4 - MPP_VIDEO_CodingMJPEG) {
    if (MVar4 == MPP_VIDEO_CodingHEVC) {
      RVar14 = (info->ctx).cu_qp_delta_depth;
      pcVar13 = "h265:diff_cu_qp_delta_depth";
LAB_001075c1:
      mpp_enc_cfg_set_s32(pvVar7,pcVar13,RVar14);
    }
    else if (MVar4 == MPP_VIDEO_CodingAVC) {
      mpp_enc_cfg_set_s32(pvVar7,"h264:profile",100);
      mpp_enc_cfg_set_s32(pvVar7,"h264:level",0x28);
      mpp_enc_cfg_set_s32(pvVar7,"h264:cabac_en",1);
      mpp_enc_cfg_set_s32(pvVar7,"h264:cabac_idc",0);
      mpp_enc_cfg_set_s32(pvVar7,"h264:trans8x8",1);
      mpp_env_get_u32("constraint_set",&constraint_set,0);
      if (((ulong)_constraint_set & 0x3f0000) != 0) {
        pcVar13 = "h264:constraint_set";
        RVar14 = constraint_set;
        goto LAB_001075c1;
      }
    }
    else {
      _mpp_log_l(2,"mpi_enc_test","unsupport encoder coding type %d\n","test_mpp_enc_cfg_setup");
    }
  }
  pRVar1 = &(info->ctx).split_mode;
  (info->ctx).split_mode = 0;
  (info->ctx).split_arg = 0;
  pRVar2 = &(info->ctx).split_arg;
  pRVar3 = &(info->ctx).split_out;
  (info->ctx).split_out = 0;
  mpp_env_get_u32("split_mode",pRVar1,0);
  mpp_env_get_u32("split_arg",pRVar2,0);
  mpp_env_get_u32("split_out",pRVar3,0);
  RVar14 = (info->ctx).split_mode;
  if (RVar14 != 0) {
    if (local_60 == 0) {
      _mpp_log_l(4,"mpi_enc_test","%p split mode %d arg %d out %d\n",0,local_68,RVar14,*pRVar2,
                 *pRVar3);
      RVar14 = *pRVar1;
    }
    mpp_enc_cfg_set_s32(pvVar7,"split:mode",RVar14);
    mpp_enc_cfg_set_s32(pvVar7,"split:arg",*pRVar2);
    mpp_enc_cfg_set_s32(pvVar7,"split:out",*pRVar3);
  }
  iVar12 = (info->ctx).gop_len;
  if (iVar12 == 0) {
    iVar12 = (info->ctx).fps_out_num * 2;
  }
  mpp_enc_cfg_set_s32(pvVar7,"rc:gop",iVar12);
  mpp_env_get_u32("gop_mode",&gop_mode,local_5c);
  if (gop_mode != 0) {
    mpp_enc_ref_cfg_init(&ref);
    if ((info->ctx).gop_mode < 4) {
      mpi_enc_gen_ref_cfg(ref,gop_mode);
    }
    else {
      mpi_enc_gen_smart_gop_ref_cfg(ref,(info->ctx).gop_len,(info->ctx).vi_len);
    }
    mpp_enc_cfg_set_ptr(pvVar7,"rc:ref_cfg",ref);
  }
  mpp_enc_cfg_set_s32(pvVar7,"tune:anti_flicker_str",(info->ctx).anti_flicker_str);
  mpp_enc_cfg_set_s32(pvVar7,"tune:atf_str",pMVar6->atf_str);
  mpp_enc_cfg_set_s32(pvVar7,"tune:atr_str_i",(info->ctx).atr_str_i);
  mpp_enc_cfg_set_s32(pvVar7,"tune:atr_str_p",(info->ctx).atr_str_p);
  mpp_enc_cfg_set_s32(pvVar7,"tune:atl_str",(info->ctx).atl_str);
  mpp_enc_cfg_set_s32(pvVar7,"tune:deblur_en",pMVar6->deblur_en);
  mpp_enc_cfg_set_s32(pvVar7,"tune:deblur_str",pMVar6->deblur_str);
  mpp_enc_cfg_set_s32(pvVar7,"tune:sao_str_i",(info->ctx).sao_str_i);
  mpp_enc_cfg_set_s32(pvVar7,"tune:sao_str_p",(info->ctx).sao_str_p);
  mpp_enc_cfg_set_s32(pvVar7,"tune:lambda_idx_p",pMVar6->lambda_idx_p);
  mpp_enc_cfg_set_s32(pvVar7,"tune:lambda_idx_i",pMVar6->lambda_idx_i);
  mpp_enc_cfg_set_s32(pvVar7,"tune:rc_container",pMVar6->rc_container);
  mpp_enc_cfg_set_s32(pvVar7,"tune:scene_mode",(info->ctx).scene_mode);
  mpp_enc_cfg_set_s32(pvVar7,"tune:speed",pMVar6->speed);
  mpp_enc_cfg_set_s32(pvVar7,"tune:vmaf_opt",0);
  bVar18 = pMVar6->rc_mode == 4;
  pRVar17 = aq_thd;
  if (bVar18) {
    pRVar17 = aq_thd_smart;
  }
  pRVar15 = aq_step_i_ipc;
  if (bVar18) {
    pRVar15 = aq_step_smart;
  }
  pRVar16 = aq_step_p_ipc;
  if (bVar18) {
    pRVar16 = aq_step_smart;
  }
  mpp_enc_cfg_set_st(pvVar7,"hw:aq_thrd_i",pRVar17);
  mpp_enc_cfg_set_st(pvVar7,"hw:aq_thrd_p",pRVar17);
  mpp_enc_cfg_set_st(pvVar7,"hw:aq_step_i",pRVar15);
  mpp_enc_cfg_set_st(pvVar7,"hw:aq_step_p",pRVar16);
  mpp_enc_cfg_set_st(pvVar7,"hw:aq_rnge_arr",aq_rnge_arr);
  mpp_enc_cfg_set_s32(pvVar7,"hw:qbias_en",1);
  mpp_enc_cfg_set_s32(pvVar7,"hw:qbias_i",pMVar6->bias_i);
  mpp_enc_cfg_set_s32(pvVar7,"hw:qbias_p",pMVar6->bias_p);
  pMVar9 = local_58;
  pvVar8 = local_68;
  MVar4 = (info->ctx).type;
  if (MVar4 == MPP_VIDEO_CodingAVC) {
    pRVar17 = qbias_arr_avc;
LAB_0010798c:
    mpp_enc_cfg_set_st(pvVar7,"hw:qbias_arr",pRVar17);
  }
  else if (MVar4 == MPP_VIDEO_CodingHEVC) {
    pRVar17 = qbias_arr_hevc;
    goto LAB_0010798c;
  }
  mpp_enc_cfg_set_s32(pvVar7,"hw:skip_bias_en",0);
  mpp_enc_cfg_set_s32(pvVar7,"hw:skip_bias",4);
  mpp_enc_cfg_set_s32(pvVar7,"hw:skip_sad",8);
  MVar11 = (*pMVar9->control)(pvVar8,MPP_ENC_SET_CFG,pvVar7);
  if (MVar11 == MPP_OK) {
    MVar4 = pMVar6->type;
    if ((MVar4 == MPP_VIDEO_CodingHEVC) || (MVar4 == MPP_VIDEO_CodingAVC)) {
      _constraint_set = "default";
      if (pMVar6->rc_mode == 4) {
        _constraint_set = "smart";
      }
      local_38 = MVar4;
      MVar11 = (*pMVar9->control)(pvVar8,MPP_ENC_SET_RC_API_CURRENT,&constraint_set);
      if (MVar11 != MPP_OK) {
        pcVar13 = "mpi control enc set rc api failed ret %d\n";
        goto LAB_001079f9;
      }
    }
    if (ref != (MppEncRefCfg)0x0) {
      mpp_enc_ref_cfg_deinit(&ref);
    }
    mpp_env_get_u32("sei_mode",&constraint_set,0);
    (info->ctx).sei_mode = constraint_set;
    MVar11 = (*pMVar9->control)(pvVar8,MPP_ENC_SET_SEI_CFG,&(info->ctx).sei_mode);
    if (MVar11 == MPP_OK) {
      MVar4 = (info->ctx).type;
      if ((MVar4 == MPP_VIDEO_CodingHEVC) || (MVar4 == MPP_VIDEO_CodingAVC)) {
        (info->ctx).header_mode = MPP_ENC_HEADER_MODE_EACH_IDR;
        MVar11 = (*pMVar9->control)(pvVar8,MPP_ENC_SET_HEADER_MODE,&(info->ctx).header_mode);
        if (MVar11 != MPP_OK) {
          pcVar13 = "mpi control enc set header mode failed ret %d\n";
          goto LAB_001079f9;
        }
      }
      mpp_env_get_u32("osd_enable",&(info->ctx).osd_enable,0);
      mpp_env_get_u32("osd_mode",&(info->ctx).osd_mode,0);
      mpp_env_get_u32("roi_enable",&(info->ctx).roi_enable,0);
      mpp_env_get_u32("user_data_enable",&(info->ctx).user_data_enable,0);
      if ((info->ctx).roi_enable == 0) {
        return MPP_OK;
      }
      mpp_enc_roi_init(&(info->ctx).roi_ctx,(info->ctx).width,(info->ctx).height,(info->ctx).type,4)
      ;
      if ((info->ctx).roi_ctx != (MppEncRoiCtx)0x0) {
        return MPP_OK;
      }
      _mpp_log_l(2,"mpi_enc_test","Assertion %s failed at %s:%d\n",0,"p->roi_ctx",
                 "test_mpp_enc_cfg_setup",0x2cb);
      if ((DAT_0011e3d3 & 0x10) == 0) {
        return MPP_OK;
      }
      abort();
    }
    pcVar13 = "mpi control enc set sei cfg failed ret %d\n";
  }
  else {
    pcVar13 = "mpi control enc set cfg failed ret %d\n";
  }
LAB_001079f9:
  _mpp_log_l(2,"mpi_enc_test",pcVar13,0,MVar11);
  return MVar11;
}

Assistant:

MPP_RET test_mpp_enc_cfg_setup(MpiEncMultiCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MppApi *mpi = p->mpi;
    MppCtx ctx = p->ctx;
    MppEncCfg cfg = p->cfg;
    RK_U32 quiet = cmd->quiet;
    MPP_RET ret;
    RK_U32 rotation;
    RK_U32 mirroring;
    RK_U32 flip;
    RK_U32 gop_mode = p->gop_mode;
    MppEncRefCfg ref = NULL;

    /* setup default parameter */
    if (p->fps_in_den == 0)
        p->fps_in_den = 1;
    if (p->fps_in_num == 0)
        p->fps_in_num = 30;
    if (p->fps_out_den == 0)
        p->fps_out_den = 1;
    if (p->fps_out_num == 0)
        p->fps_out_num = 30;

    if (!p->bps)
        p->bps = p->width * p->height / 8 * (p->fps_out_num / p->fps_out_den);

    /* setup preprocess parameters */
    mpp_enc_cfg_set_s32(cfg, "prep:width", p->width);
    mpp_enc_cfg_set_s32(cfg, "prep:height", p->height);
    mpp_enc_cfg_set_s32(cfg, "prep:hor_stride", p->hor_stride);
    mpp_enc_cfg_set_s32(cfg, "prep:ver_stride", p->ver_stride);
    mpp_enc_cfg_set_s32(cfg, "prep:format", p->fmt);
    mpp_enc_cfg_set_s32(cfg, "prep:range", MPP_FRAME_RANGE_JPEG);

    mpp_env_get_u32("mirroring", &mirroring, 0);
    mpp_env_get_u32("rotation", &rotation, 0);
    mpp_env_get_u32("flip", &flip, 0);

    mpp_enc_cfg_set_s32(cfg, "prep:mirroring", mirroring);
    mpp_enc_cfg_set_s32(cfg, "prep:rotation", rotation);
    mpp_enc_cfg_set_s32(cfg, "prep:flip", flip);

    /* setup rate control parameters */
    mpp_enc_cfg_set_s32(cfg, "rc:mode", p->rc_mode);
    mpp_enc_cfg_set_u32(cfg, "rc:max_reenc_times", 0);
    mpp_enc_cfg_set_u32(cfg, "rc:super_mode", 0);

    /* fix input / output frame rate */
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_flex", p->fps_in_flex);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_num", p->fps_in_num);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_denom", p->fps_in_den);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_flex", p->fps_out_flex);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_num", p->fps_out_num);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_denom", p->fps_out_den);

    /* drop frame or not when bitrate overflow */
    mpp_enc_cfg_set_u32(cfg, "rc:drop_mode", MPP_ENC_RC_DROP_FRM_DISABLED);
    mpp_enc_cfg_set_u32(cfg, "rc:drop_thd", 20);        /* 20% of max bps */
    mpp_enc_cfg_set_u32(cfg, "rc:drop_gap", 1);         /* Do not continuous drop frame */

    /* setup bitrate for different rc_mode */
    mpp_enc_cfg_set_s32(cfg, "rc:bps_target", p->bps);
    switch (p->rc_mode) {
    case MPP_ENC_RC_MODE_FIXQP : {
        /* do not setup bitrate on FIXQP mode */
    } break;
    case MPP_ENC_RC_MODE_CBR : {
        /* CBR mode has narrow bound */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 15 / 16);
    } break;
    case MPP_ENC_RC_MODE_VBR :
    case MPP_ENC_RC_MODE_AVBR : {
        /* VBR mode has wide bound */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 1 / 16);
    } break;
    default : {
        /* default use CBR mode */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 15 / 16);
    } break;
    }

    /* setup qp for different codec and rc_mode */
    switch (p->type) {
    case MPP_VIDEO_CodingHEVC : {
        switch (p->rc_mode) {
        case MPP_ENC_RC_MODE_FIXQP : {
            RK_S32 fix_qp = cmd->qp_init;

            mpp_enc_cfg_set_s32(cfg, "rc:qp_init", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 0);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_p", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_p", fix_qp);
        } break;
        case MPP_ENC_RC_MODE_CBR :
        case MPP_ENC_RC_MODE_VBR :
        case MPP_ENC_RC_MODE_AVBR :
        case MPP_ENC_RC_MODE_SMTRC : {
            mpp_enc_cfg_set_s32(cfg, "rc:qp_init", cmd->qp_init ? cmd->qp_init : -1);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max", cmd->qp_max ? cmd->qp_max : 51);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min", cmd->qp_min ? cmd->qp_min : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", cmd->qp_max_i ? cmd->qp_max_i : 51);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", cmd->qp_min_i ? cmd->qp_min_i : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 2);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_i", cmd->fqp_min_i ? cmd->fqp_min_i : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_i", cmd->fqp_max_i ? cmd->fqp_max_i : 45);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_p", cmd->fqp_min_p ? cmd->fqp_min_p : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_p", cmd->fqp_max_p ? cmd->fqp_max_p : 45);
        } break;
        default : {
            mpp_err_f("unsupport encoder rc mode %d\n", p->rc_mode);
        } break;
        }
    } break;
    case MPP_VIDEO_CodingVP8 : {
        /* vp8 only setup base qp range */
        mpp_enc_cfg_set_s32(cfg, "rc:qp_init", cmd->qp_init ? cmd->qp_init : 40);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_max",  cmd->qp_max ? cmd->qp_max : 127);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_min",  cmd->qp_min ? cmd->qp_min : 0);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", cmd->qp_max_i ? cmd->qp_max_i : 127);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", cmd->qp_min_i ? cmd->qp_min_i : 0);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 6);
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        /* jpeg use special codec config to control qtable */
        mpp_enc_cfg_set_s32(cfg, "jpeg:q_factor", cmd->qp_init ? cmd->qp_init : 80);
        mpp_enc_cfg_set_s32(cfg, "jpeg:qf_max", cmd->qp_max ? cmd->qp_max : 99);
        mpp_enc_cfg_set_s32(cfg, "jpeg:qf_min", cmd->qp_min ? cmd->qp_min : 1);
    } break;
    default : {
    } break;
    }

    /* setup codec  */
    mpp_enc_cfg_set_s32(cfg, "codec:type", p->type);
    switch (p->type) {
    case MPP_VIDEO_CodingAVC : {
        RK_U32 constraint_set;

        /*
         * H.264 profile_idc parameter
         * 66  - Baseline profile
         * 77  - Main profile
         * 100 - High profile
         */
        mpp_enc_cfg_set_s32(cfg, "h264:profile", 100);
        /*
         * H.264 level_idc parameter
         * 10 / 11 / 12 / 13    - qcif@15fps / cif@7.5fps / cif@15fps / cif@30fps
         * 20 / 21 / 22         - cif@30fps / half-D1@@25fps / D1@12.5fps
         * 30 / 31 / 32         - D1@25fps / 720p@30fps / 720p@60fps
         * 40 / 41 / 42         - 1080p@30fps / 1080p@30fps / 1080p@60fps
         * 50 / 51 / 52         - 4K@30fps
         */
        mpp_enc_cfg_set_s32(cfg, "h264:level", 40);
        mpp_enc_cfg_set_s32(cfg, "h264:cabac_en", 1);
        mpp_enc_cfg_set_s32(cfg, "h264:cabac_idc", 0);
        mpp_enc_cfg_set_s32(cfg, "h264:trans8x8", 1);

        mpp_env_get_u32("constraint_set", &constraint_set, 0);
        if (constraint_set & 0x3f0000)
            mpp_enc_cfg_set_s32(cfg, "h264:constraint_set", constraint_set);
    } break;
    case MPP_VIDEO_CodingHEVC : {
        mpp_enc_cfg_set_s32(cfg, "h265:diff_cu_qp_delta_depth", p->cu_qp_delta_depth);
    } break;
    case MPP_VIDEO_CodingMJPEG :
    case MPP_VIDEO_CodingVP8 : {
    } break;
    default : {
        mpp_err_f("unsupport encoder coding type %d\n", p->type);
    } break;
    }

    p->split_mode = 0;
    p->split_arg = 0;
    p->split_out = 0;

    mpp_env_get_u32("split_mode", &p->split_mode, MPP_ENC_SPLIT_NONE);
    mpp_env_get_u32("split_arg", &p->split_arg, 0);
    mpp_env_get_u32("split_out", &p->split_out, 0);

    if (p->split_mode) {
        mpp_log_q(quiet, "%p split mode %d arg %d out %d\n", ctx,
                  p->split_mode, p->split_arg, p->split_out);
        mpp_enc_cfg_set_s32(cfg, "split:mode", p->split_mode);
        mpp_enc_cfg_set_s32(cfg, "split:arg", p->split_arg);
        mpp_enc_cfg_set_s32(cfg, "split:out", p->split_out);
    }

    // config gop_len and ref cfg
    mpp_enc_cfg_set_s32(cfg, "rc:gop", p->gop_len ? p->gop_len : p->fps_out_num * 2);

    mpp_env_get_u32("gop_mode", &gop_mode, gop_mode);
    if (gop_mode) {
        mpp_enc_ref_cfg_init(&ref);

        if (p->gop_mode < 4)
            mpi_enc_gen_ref_cfg(ref, gop_mode);
        else
            mpi_enc_gen_smart_gop_ref_cfg(ref, p->gop_len, p->vi_len);

        mpp_enc_cfg_set_ptr(cfg, "rc:ref_cfg", ref);
    }

    /* setup fine tuning paramters */
    mpp_enc_cfg_set_s32(cfg, "tune:anti_flicker_str", p->anti_flicker_str);
    mpp_enc_cfg_set_s32(cfg, "tune:atf_str", cmd->atf_str);
    mpp_enc_cfg_set_s32(cfg, "tune:atr_str_i", p->atr_str_i);
    mpp_enc_cfg_set_s32(cfg, "tune:atr_str_p", p->atr_str_p);
    mpp_enc_cfg_set_s32(cfg, "tune:atl_str", p->atl_str);
    mpp_enc_cfg_set_s32(cfg, "tune:deblur_en", cmd->deblur_en);
    mpp_enc_cfg_set_s32(cfg, "tune:deblur_str", cmd->deblur_str);
    mpp_enc_cfg_set_s32(cfg, "tune:sao_str_i", p->sao_str_i);
    mpp_enc_cfg_set_s32(cfg, "tune:sao_str_p", p->sao_str_p);
    mpp_enc_cfg_set_s32(cfg, "tune:lambda_idx_p", cmd->lambda_idx_p);
    mpp_enc_cfg_set_s32(cfg, "tune:lambda_idx_i", cmd->lambda_idx_i);
    mpp_enc_cfg_set_s32(cfg, "tune:rc_container", cmd->rc_container);
    mpp_enc_cfg_set_s32(cfg, "tune:scene_mode", p->scene_mode);
    mpp_enc_cfg_set_s32(cfg, "tune:speed", cmd->speed);
    mpp_enc_cfg_set_s32(cfg, "tune:vmaf_opt", 0);

    /* setup hardware specified parameters */
    if (cmd->rc_mode == MPP_ENC_RC_MODE_SMTRC) {
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_i", aq_thd_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_p", aq_thd_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_step_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_p", aq_step_smart);
    } else {
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_i", aq_thd);
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_p", aq_thd);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_step_i_ipc);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_p", aq_step_p_ipc);
    }
    mpp_enc_cfg_set_st(cfg, "hw:aq_rnge_arr", aq_rnge_arr);

    mpp_enc_cfg_set_s32(cfg, "hw:qbias_en", 1);
    mpp_enc_cfg_set_s32(cfg, "hw:qbias_i", cmd->bias_i);
    mpp_enc_cfg_set_s32(cfg, "hw:qbias_p", cmd->bias_p);

    if (p->type == MPP_VIDEO_CodingAVC) {
        mpp_enc_cfg_set_st(cfg, "hw:qbias_arr", qbias_arr_avc);
    } else if (p->type == MPP_VIDEO_CodingHEVC) {
        mpp_enc_cfg_set_st(cfg, "hw:qbias_arr", qbias_arr_hevc);
    }

    mpp_enc_cfg_set_s32(cfg, "hw:skip_bias_en", 0);
    mpp_enc_cfg_set_s32(cfg, "hw:skip_bias", 4);
    mpp_enc_cfg_set_s32(cfg, "hw:skip_sad", 8);

    ret = mpi->control(ctx, MPP_ENC_SET_CFG, cfg);
    if (ret) {
        mpp_err("mpi control enc set cfg failed ret %d\n", ret);
        goto RET;
    }

    if (cmd->type == MPP_VIDEO_CodingAVC || cmd->type == MPP_VIDEO_CodingHEVC) {
        RcApiBrief rc_api_brief;
        rc_api_brief.type = cmd->type;
        rc_api_brief.name = (cmd->rc_mode == MPP_ENC_RC_MODE_SMTRC) ?
                            "smart" : "default";

        ret = mpi->control(ctx, MPP_ENC_SET_RC_API_CURRENT, &rc_api_brief);
        if (ret) {
            mpp_err("mpi control enc set rc api failed ret %d\n", ret);
            goto RET;
        }
    }

    if (ref)
        mpp_enc_ref_cfg_deinit(&ref);

    /* optional */
    {
        RK_U32 sei_mode;

        mpp_env_get_u32("sei_mode", &sei_mode, MPP_ENC_SEI_MODE_DISABLE);
        p->sei_mode = sei_mode;
        ret = mpi->control(ctx, MPP_ENC_SET_SEI_CFG, &p->sei_mode);
        if (ret) {
            mpp_err("mpi control enc set sei cfg failed ret %d\n", ret);
            goto RET;
        }
    }

    if (p->type == MPP_VIDEO_CodingAVC || p->type == MPP_VIDEO_CodingHEVC) {
        p->header_mode = MPP_ENC_HEADER_MODE_EACH_IDR;
        ret = mpi->control(ctx, MPP_ENC_SET_HEADER_MODE, &p->header_mode);
        if (ret) {
            mpp_err("mpi control enc set header mode failed ret %d\n", ret);
            goto RET;
        }
    }

    /* setup test mode by env */
    mpp_env_get_u32("osd_enable", &p->osd_enable, 0);
    mpp_env_get_u32("osd_mode", &p->osd_mode, MPP_ENC_OSD_PLT_TYPE_DEFAULT);
    mpp_env_get_u32("roi_enable", &p->roi_enable, 0);
    mpp_env_get_u32("user_data_enable", &p->user_data_enable, 0);

    if (p->roi_enable) {
        mpp_enc_roi_init(&p->roi_ctx, p->width, p->height, p->type, 4);
        mpp_assert(p->roi_ctx);
    }

RET:
    return ret;
}